

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_time.cpp
# Opt level: O0

RK_S64 mpp_clock_reset(MppClock clock)

{
  MPP_RET MVar1;
  MppClockImpl *p;
  MppClock clock_local;
  
  if ((clock != (MppClock)0x0) && (MVar1 = check_is_mpp_clock(clock), MVar1 == MPP_OK)) {
    *(undefined8 *)((long)clock + 0x20) = 0;
    *(undefined8 *)((long)clock + 0x28) = 0;
    *(undefined8 *)((long)clock + 0x30) = 0;
    *(undefined8 *)((long)clock + 0x38) = 0;
    return 0;
  }
  _mpp_log_l(2,"mpp_time","invalid clock %p\n","mpp_clock_reset",clock);
  return 0;
}

Assistant:

RK_S64 mpp_clock_reset(MppClock clock)
{
    if (NULL == clock || check_is_mpp_clock(clock)) {
        mpp_err_f("invalid clock %p\n", clock);
    } else {
        MppClockImpl *p = (MppClockImpl *)clock;

        p->base = 0;
        p->time = 0;
        p->sum = 0;
        p->count = 0;
    }

    return 0;
}